

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::CheckForSemicolon(XFileParser *this)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  string local_30;
  XFileParser *local_10;
  XFileParser *this_local;
  
  if ((this->mIsBinaryFormat & 1U) == 0) {
    local_10 = this;
    GetNextToken_abi_cxx11_(&local_30,this);
    bVar1 = std::operator!=(&local_30,";");
    std::__cxx11::string::~string((string *)&local_30);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Semicolon expected.",&local_61);
      ThrowException(this,&local_60);
    }
  }
  return;
}

Assistant:

void XFileParser::CheckForSemicolon()
{
    if( mIsBinaryFormat)
        return;

    if( GetNextToken() != ";")
        ThrowException( "Semicolon expected.");
}